

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

bool __thiscall gui::MenuBar::handleMouseMove(MenuBar *this,Vector2f *mouseParent)

{
  bool bVar1;
  uint uVar2;
  Widget *in_RSI;
  Widget *in_RDI;
  Vector2f mouseLocal;
  Vector2f *in_stack_00000030;
  bool in_stack_0000003e;
  bool in_stack_0000003f;
  MenuBar *in_stack_00000040;
  Vector2f *in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = Widget::handleMouseMove(in_RDI,(Vector2f *)in_RSI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    uVar2 = (*(in_RDI->super_Drawable)._vptr_Drawable[6])(in_RDI,in_RSI);
    if ((uVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      Widget::toLocalOriginSpace(in_RSI,in_stack_ffffffffffffffe0);
      mouseUpdate(in_stack_00000040,in_stack_0000003f,in_stack_0000003e,in_stack_00000030);
      local_1 = Widget::isFocused(in_RDI);
    }
  }
  return local_1;
}

Assistant:

bool MenuBar::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    } else if (!isMouseIntersecting(mouseParent)) {
        return false;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    mouseUpdate(false, false, mouseLocal);
    return isFocused();
}